

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_generic_fwrite(mcpl_generic_wfilehandle_t *fh,char *src,uint64_t nbytes)

{
  char *pcVar1;
  char *in_RDX;
  mcpl_generic_wfilehandle_t *in_RSI;
  undefined8 *in_RDI;
  size_t written;
  size_t to_write;
  uint64_t chunk_max;
  uint64_t in_stack_ffffffffffffffe0;
  
  for (; (char *)0x1fffffff < in_RDX; in_RDX = in_RDX + -0x1fffffff) {
    mcpl_generic_fwrite(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    in_RSI = (mcpl_generic_wfilehandle_t *)((long)&in_RSI[0x1555555].internal + 7);
  }
  if (in_RDX != (char *)0x0) {
    pcVar1 = (char *)fwrite(in_RSI,1,(size_t)in_RDX,(FILE *)*in_RDI);
    in_RDI[1] = pcVar1 + in_RDI[1];
    if (pcVar1 != in_RDX) {
      mcpl_error((char *)0x10a3f9);
    }
  }
  return;
}

Assistant:

void mcpl_generic_fwrite( mcpl_generic_wfilehandle_t* fh,
                          const char * src, uint64_t nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(int) >= sizeof(int32_t) );

  //Write nbytes. For safety, we do this in chunks well inside 32bit limit.
  const uint64_t chunk_max = INT32_MAX / 4;
  while ( nbytes > chunk_max ) {
    mcpl_generic_fwrite( fh, src, chunk_max );
    nbytes -= chunk_max;
    src += chunk_max;
  }

  if ( !nbytes )
    return;

  size_t to_write = (size_t)nbytes;
  size_t written = fwrite( src, 1, to_write, (FILE*)(fh->internal) );
  fh->current_pos += written;
  if ( written != to_write )
    mcpl_error("Error while writing to file");
}